

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::Context::~Context(Context *this)

{
  this->_vptr_Context = (_func_int **)&PTR__Context_0022d530;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->parent_).super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Value::~Value(&this->values_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<minja::Context>)._M_weak_this.
              super___weak_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

virtual ~Context() {}